

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::repr(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  long lVar4;
  int local_98;
  allocator local_69;
  string local_68 [36];
  int local_44;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  int temp_int;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  iterator it;
  string *str_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\'");
  local_38._M_current = (char *)std::__cxx11::string::begin();
  do {
    _Stack_40._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffc0);
    if (!bVar2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\'");
      return __return_storage_ptr__;
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    cVar1 = *pcVar3;
    if (cVar1 == '\t') {
LAB_00110c27:
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 4) {
        local_98 = 4;
      }
      else {
        local_98 = std::__cxx11::string::size();
        local_98 = 4 - local_98;
      }
      local_44 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,(long)local_98,' ',&local_69);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else if (cVar1 == '\n') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
    }
    else {
      if (cVar1 == '\r') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
        goto LAB_00110c27;
      }
      if (cVar1 == '\"') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
      }
      else if (cVar1 == '\'') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\'");
      }
      else if (cVar1 == '\\') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_38);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

string repr(string str) {
    string result;
    result += "\'";

    for (auto it = str.begin(); it != str.end(); ++it) {
        int temp_int;
        switch(*it) {
        case '\\':
            result += "\\\\";
            break;
        case '\'':
            result += "\\\'";
            break;
        case '\"':
            result += "\\\"";
            break;
        case '\n':
            result += "\\n";
            break;
        case '\r':
            result += "\\r";
        case '\t':
            temp_int = (4 - result.size())?(4 - result.size()):4;
            result += string(temp_int, ' ');
            break;
        default:
            result += *it;
            break;
        }
    }

    result += "\'";
    return result;
}